

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointTest.cpp
# Opt level: O3

void __thiscall PointPseudoLog0::test_method(PointPseudoLog0 *this)

{
  RealSpace R3;
  Point y;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_208;
  undefined8 *local_200;
  RealSpace local_1b0 [120];
  Ref local_138 [296];
  
  mnf::RealSpace::RealSpace(local_1b0,3);
  local_200 = &local_238;
  local_238 = 0x3ff0000000000000;
  uStack_230 = 0x4000000000000000;
  local_228 = 0x4008000000000000;
  uStack_208 = 0x4000000000000000;
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  construct<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ();
  mnf::Manifold::createPoint(local_138);
  free((void *)0x0);
  mnf::Point::pseudoLog0();
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 3, 1>]"
               );
}

Assistant:

BOOST_AUTO_TEST_CASE(PointPseudoLog0)
{
  RealSpace R3(3);
  Eigen::Vector3d v(1, 2, 3);

  Point y = R3.createPoint(2 * v);
  Eigen::Vector3d res;

  res = y.pseudoLog0();
  BOOST_CHECK(res.isApprox(2 * v));
}